

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::SerializeV2Stream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  HashedSourceWriter<AutoFile> *pHVar1;
  bool bVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  uchar local_2a;
  BIP155Network local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsInternal(this);
  if (bVar2) {
    local_2a = '\x02';
    pHVar1 = s->m_substream;
    AutoFile::write(pHVar1->m_source,(int)&local_2a,(void *)0x1,in_RCX);
    CSHA256::Write((CSHA256 *)pHVar1,&local_2a,1);
    WriteCompactSize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(s,0x10);
    SerializeV1Stream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(this,s);
  }
  else {
    local_29 = GetBIP155Network(this);
    pHVar1 = s->m_substream;
    AutoFile::write(pHVar1->m_source,(int)&local_29,(void *)0x1,in_RCX);
    CSHA256::Write((CSHA256 *)pHVar1,&local_29,1);
    ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
              ((ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams> *)s,&this->m_addr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV2Stream(Stream& s) const
    {
        if (IsInternal()) {
            // Serialize NET_INTERNAL as embedded in IPv6. We need to
            // serialize such addresses from addrman.
            s << static_cast<uint8_t>(BIP155Network::IPV6);
            s << COMPACTSIZE(ADDR_IPV6_SIZE);
            SerializeV1Stream(s);
            return;
        }

        s << static_cast<uint8_t>(GetBIP155Network());
        s << m_addr;
    }